

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O0

char * __thiscall Confparse::Parse(Confparse *this,char *key)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  char *in_RSI;
  long in_RDI;
  bool bVar5;
  size_t i;
  int keylen;
  char *llimit;
  char *op;
  char *p;
  ulong local_40;
  char *local_20;
  
  *(undefined1 *)(in_RDI + 0x28) = 0;
  if (*(long *)(in_RDI + 0x2828) == 0) {
    return (char *)0x0;
  }
  if (in_RSI == (char *)0x0) {
    return (char *)0x0;
  }
  if (**(char **)(in_RDI + 0x2828) == '\0') {
    return (char *)0x0;
  }
  if (*in_RSI == '\0') {
    return (char *)0x0;
  }
  sVar4 = strlen(in_RSI);
  if ((int)sVar4 == 0) {
    return (char *)0x0;
  }
  local_20 = strstr(*(char **)(in_RDI + 0x2828),in_RSI);
  if (local_20 == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar1 = *(char **)(in_RDI + 0x2830);
  do {
    pcVar2 = local_20;
    if (local_20 == (char *)0x0 || pcVar1 <= local_20) {
      return (char *)0x0;
    }
    local_20 = local_20 + (int)sVar4;
    if ((local_20 < pcVar1) && (iVar3 = isalnum((int)*local_20), iVar3 == 0)) {
      while( true ) {
        bVar5 = false;
        if ((local_20 < pcVar1) &&
           ((bVar5 = true, *local_20 != '=' && (bVar5 = true, *local_20 != ' ')))) {
          bVar5 = *local_20 == '\t';
        }
        if (!bVar5) break;
        local_20 = local_20 + 1;
      }
      if (((local_20 < pcVar1) && (*(char **)(in_RDI + 0x2828) <= local_20)) &&
         ((pcVar2 == *(char **)(in_RDI + 0x2828) || ((pcVar2[-1] == '\r' || (pcVar2[-1] == '\n')))))
         ) {
        local_40 = 0;
        break;
      }
    }
    if (*(char **)(in_RDI + 0x2830) <= pcVar2) {
      return (char *)0x0;
    }
    local_20 = strstr(pcVar2 + 1,in_RSI);
    if (local_20 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
  while( true ) {
    *(char *)(in_RDI + 0x28 + local_40) = *local_20;
    local_20 = local_20 + 1;
    local_40 = local_40 + 1;
    if (0x27ff < local_40) break;
    bVar5 = false;
    if (((local_20 < *(char **)(in_RDI + 0x2830)) && (bVar5 = false, *local_20 != '\0')) &&
       (bVar5 = false, *local_20 != '\n')) {
      bVar5 = *local_20 != '\r';
    }
    if (!bVar5) break;
  }
  *(undefined1 *)(in_RDI + 0x28 + local_40) = 0;
  return (char *)(in_RDI + 0x28);
}

Assistant:

char *Confparse::Parse(const char *key) {
	char *p, *op;
	char *llimit;
	int keylen;

	value[0] = '\0';

	if (!conf) return NULL;
	if (!key) return NULL;

	if (!conf[0]) return NULL;
	if (!key[0]) return NULL;

	keylen = strlen(key);
	if (keylen == 0) return NULL;

	p = strstr(conf, key);
	if (p == NULL) {
		return NULL;
	}

	op = p;

	llimit = limit; // - keylen - 2; // allows for up to 'key=x'

	while (p && p < llimit) {

		/*
		 * Consume the name<whitespace>=<whitespace> trash before we
		 * get to the actual value.  While this does mean things are
		 * slightly less strict in the configuration file text it can
		 * assist in making it easier for people to read it.
		 */
		p = p + keylen;

		if ((p < llimit) && (!isalnum(*p))) {

			while ((p < llimit) && ((*p == '=') || (*p == ' ') || (*p == '\t'))) p++; // get up to the start of the value;

			if ((p < llimit) && (p >= conf)) {

				/*
				 * Check that the location of the strstr() return is
				 * left aligned to the start of the line. This prevents
				 * us picking up trash name=value pairs among the general
				 * text within the file
				 */
				if ((op == conf) || (*(op - 1) == '\r') || (*(op - 1) == '\n')) {
					size_t i = 0;

					/*
					 * Search for the end of the data by finding the end of the line
					 */
					while ((p < limit) && ((*p != '\0') && (*p != '\n') && (*p != '\r'))) {
						value[i] = *p;
						p++;
						i++;
						if (i >= CONFPARSE_MAX_VALUE_SIZE) break;
					}
					value[i] = '\0';
					return value;
				}
			}
		}

		// if the previous strstr() was a non-success, then try search again from the next bit
		if (op < limit) {
			p = strstr(op + 1, key);
			if (!p) break;
			op = p;
		} else {
			break;
		}
	}
	return NULL;
}